

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

size_t __thiscall CServiceHash::operator()(CServiceHash *this,CService *a)

{
  Span<const_unsigned_char> data;
  uint64_t uVar1;
  CSipHasher *in_RSI;
  long in_FS_OFFSET;
  CSipHasher hasher;
  type in_stack_ffffffffffffff98;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffc0;
  CSipHasher *in_stack_ffffffffffffffc8;
  CSipHasher *in_stack_ffffffffffffffd8;
  uchar *in_stack_fffffffffffffff0;
  size_t sVar2;
  
  sVar2 = *(size_t *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher
            (in_RSI,(uint64_t)in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98);
  CSipHasher::Write(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  CSipHasher::Write(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Span<unsigned_char_const>::Span<prevector<16u,unsigned_char,unsigned_int,int>>
            ((Span<const_unsigned_char> *)in_RSI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
            );
  data.m_size = sVar2;
  data.m_data = in_stack_fffffffffffffff0;
  CSipHasher::Write(in_stack_ffffffffffffffd8,data);
  uVar1 = CSipHasher::Finalize(in_stack_ffffffffffffffc8);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t operator()(const CService& a) const noexcept
    {
        CSipHasher hasher(m_salt_k0, m_salt_k1);
        hasher.Write(a.m_net);
        hasher.Write(a.port);
        hasher.Write(a.m_addr);
        return static_cast<size_t>(hasher.Finalize());
    }